

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O0

void __thiscall
dynet::UnidirectionalTreeLSTMBuilder::UnidirectionalTreeLSTMBuilder
          (UnidirectionalTreeLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  undefined8 *in_RDI;
  VanillaLSTMBuilder *in_R8;
  undefined1 in_stack_00000437;
  ParameterCollection *in_stack_00000438;
  uint in_stack_00000444;
  uint in_stack_00000448;
  uint in_stack_0000044c;
  VanillaLSTMBuilder *in_stack_00000450;
  VanillaLSTMBuilder *pVVar1;
  TreeLSTMBuilder *in_stack_fffffffffffffd10;
  ParameterCollection *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffef0;
  ParameterCollection *in_stack_fffffffffffffef8;
  allocator local_f1;
  string local_f0 [208];
  VanillaLSTMBuilder *local_20;
  
  local_20 = in_R8;
  TreeLSTMBuilder::TreeLSTMBuilder(in_stack_fffffffffffffd10);
  *in_RDI = &PTR__UnidirectionalTreeLSTMBuilder_01049580;
  ParameterCollection::ParameterCollection(in_stack_fffffffffffffd50);
  VanillaLSTMBuilder::VanillaLSTMBuilder((VanillaLSTMBuilder *)(in_RDI + 0x1a));
  pVVar1 = (VanillaLSTMBuilder *)(in_RDI + 0x54);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc4e6e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"unidirectional-tree-lstm-builder",&local_f1);
  ParameterCollection::add_subcollection(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  ParameterCollection::operator=((ParameterCollection *)local_20,(ParameterCollection *)pVVar1);
  ParameterCollection::~ParameterCollection((ParameterCollection *)local_20);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_stack_00000450,in_stack_0000044c,in_stack_00000448,in_stack_00000444,
             in_stack_00000438,(bool)in_stack_00000437);
  VanillaLSTMBuilder::operator=(local_20,pVVar1);
  VanillaLSTMBuilder::~VanillaLSTMBuilder(local_20);
  return;
}

Assistant:

UnidirectionalTreeLSTMBuilder::UnidirectionalTreeLSTMBuilder(unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         ParameterCollection& model) {
  local_model = model.add_subcollection("unidirectional-tree-lstm-builder");
  node_builder = LSTMBuilder(layers, input_dim, hidden_dim, local_model);
}